

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmGhsMultiTargetGenerator::WriteSources(cmGhsMultiTargetGenerator *this,ostream *fout_proj)

{
  pointer *this_00;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *pvVar1;
  cmGeneratorTarget *this_01;
  cmMakefile *pcVar2;
  cmSourceFile *this_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  __first;
  iterator iVar3;
  bool bVar4;
  byte bVar5;
  __type _Var6;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *__x;
  size_type __n;
  size_type sVar7;
  reference pbVar8;
  reference pvVar9;
  reference __k;
  iterator iVar10;
  iterator iVar11;
  char *pcVar12;
  ulong uVar13;
  string *psVar14;
  cmGeneratedFileStream *this_03;
  cmGlobalGhsMultiGenerator *this_04;
  ostream *poVar15;
  mapped_type *pmVar16;
  reference ppcVar17;
  __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  __middle;
  iterator __last;
  reference ppcVar18;
  cmCustomCommand *pcVar19;
  cmSourceFileLocation *pcVar20;
  reference ppcVar21;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar22;
  bool local_be2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b28;
  cmGeneratedFileStream *f_2;
  iterator __end1_5;
  iterator __begin1_5;
  vector<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_> *__range1_5;
  cmGeneratedFileStream f_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_780;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  undefined1 local_740 [8];
  string fname_1;
  undefined1 local_700 [8];
  cmCustomCommandGenerator ccg;
  cmCustomCommand *cc;
  cmSourceFile **sf_2;
  iterator __end4;
  iterator __begin4;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__range4;
  int cmdcount;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  local_5e8;
  __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  local_5e0;
  iterator sf_1;
  undefined1 local_5b8 [8];
  string message;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> customCommands;
  string objectName;
  string local_558;
  allocator<char> local_531;
  string local_530;
  allocator<char> local_509;
  string local_508;
  allocator<char> local_4e1;
  string local_4e0;
  allocator<char> local_4b9;
  string local_4b8;
  allocator<char> local_491;
  string local_490;
  byte local_469;
  string local_468;
  string local_448 [8];
  string comment;
  string fname;
  bool compile;
  cmSourceFile *si;
  iterator __end3;
  iterator __begin3;
  mapped_type *__range3;
  cmGeneratedFileStream *f;
  string fpath;
  string lpath;
  string gname;
  string local_370;
  allocator<char> local_349;
  string local_348;
  byte local_321;
  ostream *poStack_320;
  bool useProjectFile;
  ostream *fout;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *sg;
  iterator __end1_4;
  iterator __begin1_4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_4;
  vector<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_> gfiles;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *n_3;
  iterator __end1_3;
  iterator __begin1_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *n_2;
  iterator __end1_2;
  iterator __begin1_2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_2;
  _Self local_280;
  iterator n_1;
  string gn_2;
  _Self local_250;
  iterator n;
  string *gn_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groupFilesList;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  iterator local_138;
  size_type local_130;
  undefined1 local_128 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  standardGroups;
  undefined1 local_100 [8];
  string gn;
  cmSourceGroup *sourceGroup;
  cmSourceFile **sf;
  iterator __end1;
  iterator __begin1;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *__range1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groupNames;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
  groupFiles;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> sourceGroups;
  undefined1 local_30 [8];
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  ostream *fout_proj_local;
  cmGhsMultiTargetGenerator *this_local;
  
  sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)fout_proj;
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector
            ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_30);
  cmGeneratorTarget::GetSourceFiles
            (this->GeneratorTarget,
             (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_30,&this->ConfigName);
  __x = cmMakefile::GetSourceGroups(this->Makefile);
  std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::vector
            ((vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)
             &groupFiles._M_t._M_impl.super__Rb_tree_header._M_node_count,__x);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
         *)&groupNames._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&__range1);
  __end1 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                     ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_30);
  sf = (cmSourceFile **)
       std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                 ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_30);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                                     *)&sf), bVar4) {
    ppcVar17 = __gnu_cxx::
               __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
               ::operator*(&__end1);
    pcVar2 = this->Makefile;
    psVar14 = cmSourceFile::GetFullPath(*ppcVar17,(string *)0x0);
    gn.field_2._8_8_ =
         cmMakefile::FindSourceGroup
                   (pcVar2,psVar14,
                    (vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)
                    &groupFiles._M_t._M_impl.super__Rb_tree_header._M_node_count);
    psVar14 = cmSourceGroup::GetFullName_abi_cxx11_((cmSourceGroup *)gn.field_2._8_8_);
    std::__cxx11::string::string((string *)local_100,(string *)psVar14);
    pmVar16 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                            *)&groupNames._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           (key_type *)local_100);
    std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back(pmVar16,ppcVar17);
    pVar22 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range1,(value_type *)local_100);
    standardGroups.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pVar22.first._M_node;
    std::__cxx11::string::~string((string *)local_100);
    __gnu_cxx::
    __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
    ::operator++(&__end1);
  }
  groupFilesList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"CMake Rules",
             (allocator<char> *)
             ((long)&groupFilesList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1d8,"Header Files",
             (allocator<char> *)
             ((long)&groupFilesList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1b8,"Source Files",
             (allocator<char> *)
             ((long)&groupFilesList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_198,"Object Files",
             (allocator<char> *)
             ((long)&groupFilesList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_178,"Object Libraries",
             (allocator<char> *)
             ((long)&groupFilesList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_158,"Resources",
             (allocator<char> *)
             ((long)&groupFilesList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 2));
  groupFilesList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ = 0;
  local_138 = &local_1f8;
  local_130 = 6;
  this_00 = &groupFilesList.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)this_00);
  __l._M_len = local_130;
  __l._M_array = local_138;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_128,__l,(allocator_type *)this_00);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&groupFilesList.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_b28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_138;
  do {
    local_b28 = local_b28 + -1;
    std::__cxx11::string::~string((string *)local_b28);
  } while (local_b28 != &local_1f8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&groupFilesList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 2));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&groupFilesList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&groupFilesList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&groupFilesList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&groupFilesList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&groupFilesList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  __n = std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
        ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                *)&groupNames._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&__range1_1 + 7));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&i,__n,
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&__range1_1 + 7));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&__range1_1 + 7));
  __range1_1._0_4_ = 0;
  __end1_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_128);
  gn_1 = (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_128);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&gn_1), bVar4) {
    n._M_node = (_Base_ptr)
                __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1_1);
    local_250._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1,(key_type *)n._M_node);
    gn_2.field_2._8_8_ =
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range1);
    bVar4 = std::operator!=(&local_250,(_Self *)((long)&gn_2.field_2 + 8));
    if (bVar4) {
      pbVar8 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_250);
      pvVar9 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&i,(long)(int)__range1_1);
      std::__cxx11::string::operator=((string *)pvVar9,(string *)pbVar8);
      __range1_1._0_4_ = (int)__range1_1 + 1;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range1,(key_type *)n._M_node);
    }
    else if ((this->TagType == CUSTOM_TARGET) &&
            (bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)n._M_node,"CMake Rules"), bVar4)) {
      sVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&i);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&i,sVar7 + 1);
      iVar3 = n;
      pvVar9 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&i,(long)(int)__range1_1);
      std::__cxx11::string::operator=((string *)pvVar9,(string *)iVar3._M_node);
      __range1_1._0_4_ = (int)__range1_1 + 1;
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_1);
  }
  std::__cxx11::string::string((string *)&n_1);
  local_280._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range1,(key_type *)&n_1);
  __range1_2 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&__range1);
  bVar4 = std::operator!=(&local_280,(_Self *)&__range1_2);
  if (bVar4) {
    pbVar8 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_280);
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&i);
    std::__cxx11::string::operator=((string *)pvVar9,(string *)pbVar8);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1,(key_type *)&n_1);
  }
  std::__cxx11::string::~string((string *)&n_1);
  __end1_2 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range1);
  n_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range1);
  while (bVar4 = std::operator!=(&__end1_2,(_Self *)&n_2), bVar4) {
    pbVar8 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1_2);
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&i,(long)(int)__range1_1);
    std::__cxx11::string::operator=((string *)pvVar9,(string *)pbVar8);
    __range1_1._0_4_ = (int)__range1_1 + 1;
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1_2);
  }
  __end1_3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&i);
  n_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&i);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1_3,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&n_3), bVar4) {
    __k = __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&__end1_3);
    pmVar16 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                            *)&groupNames._M_t._M_impl.super__Rb_tree_header._M_node_count,__k);
    iVar10 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin(pmVar16);
    pmVar16 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                            *)&groupNames._M_t._M_impl.super__Rb_tree_header._M_node_count,__k);
    iVar11 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end(pmVar16);
    std::
    sort<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,cmGhsMultiTargetGenerator::WriteSources(std::ostream&)::__0>
              (iVar10._M_current,iVar11._M_current);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_3);
  }
  std::vector<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_>::vector
            ((vector<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_> *)
             &__range1_4);
  __end1_4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&i);
  sg = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&i);
  do {
    bVar4 = __gnu_cxx::operator!=
                      (&__end1_4,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&sg);
    if (!bVar4) {
      __end1_5 = std::vector<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_>::
                 begin((vector<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_> *)
                       &__range1_4);
      f_2 = (cmGeneratedFileStream *)
            std::vector<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_>::end
                      ((vector<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_> *)
                       &__range1_4);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end1_5,
                                (__normal_iterator<cmGeneratedFileStream_**,_std::vector<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_>_>
                                 *)&f_2), bVar4) {
        ppcVar21 = __gnu_cxx::
                   __normal_iterator<cmGeneratedFileStream_**,_std::vector<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_>_>
                   ::operator*(&__end1_5);
        cmGeneratedFileStream::Close(*ppcVar21);
        __gnu_cxx::
        __normal_iterator<cmGeneratedFileStream_**,_std::vector<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_>_>
        ::operator++(&__end1_5);
      }
      std::vector<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_>::~vector
                ((vector<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_> *)
                 &__range1_4);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&i);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_128);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
              *)&groupNames._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::~vector
                ((vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)
                 &groupFiles._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
                ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_30);
      return;
    }
    fout = (ostream *)
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end1_4);
    this_01 = this->GeneratorTarget;
    std::allocator<char>::allocator();
    gname.field_2._M_local_buf[0xe] = '\0';
    gname.field_2._M_local_buf[0xd] = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,"GHS_NO_SOURCE_GROUP_FILE",&local_349);
    pcVar12 = cmGeneratorTarget::GetProperty(this_01,&local_348);
    bVar4 = cmSystemTools::IsOn(pcVar12);
    local_be2 = true;
    if (!bVar4) {
      pcVar2 = this->Makefile;
      std::allocator<char>::allocator();
      gname.field_2._M_local_buf[0xe] = '\x01';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_370,"CMAKE_GHS_NO_SOURCE_GROUP_FILE",
                 (allocator<char> *)(gname.field_2._M_local_buf + 0xf));
      gname.field_2._M_local_buf[0xd] = '\x01';
      pcVar12 = cmMakefile::GetDefinition(pcVar2,&local_370);
      local_be2 = cmSystemTools::IsOn(pcVar12);
    }
    if ((gname.field_2._M_local_buf[0xd] & 1U) != 0) {
      std::__cxx11::string::~string((string *)&local_370);
    }
    if ((gname.field_2._M_local_buf[0xe] & 1U) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)(gname.field_2._M_local_buf + 0xf));
    }
    std::__cxx11::string::~string((string *)&local_348);
    std::allocator<char>::~allocator(&local_349);
    local_321 = local_be2;
    if ((local_be2 == false) && (uVar13 = std::__cxx11::string::empty(), (uVar13 & 1) == 0)) {
      std::__cxx11::string::string((string *)(lpath.field_2._M_local_buf + 8),(string *)fout);
      cmsys::SystemTools::ReplaceString((string *)((long)&lpath.field_2 + 8),"\\","_");
      (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xc])
                ((undefined1 *)((long)&fpath.field_2 + 8),this->LocalGenerator,this->GeneratorTarget
                );
      std::__cxx11::string::operator+=((string *)(fpath.field_2._M_local_buf + 8),"/");
      std::__cxx11::string::operator+=
                ((string *)(fpath.field_2._M_local_buf + 8),
                 (string *)(lpath.field_2._M_local_buf + 8));
      std::__cxx11::string::operator+=
                ((string *)(fpath.field_2._M_local_buf + 8),
                 cmGlobalGhsMultiGenerator::FILE_EXTENSION);
      psVar14 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                          (&this->LocalGenerator->super_cmLocalGenerator);
      std::__cxx11::string::string((string *)&f,(string *)psVar14);
      std::__cxx11::string::operator+=((string *)&f,"/");
      std::__cxx11::string::operator+=((string *)&f,(string *)(fpath.field_2._M_local_buf + 8));
      this_03 = (cmGeneratedFileStream *)operator_new(0x248);
      cmGeneratedFileStream::cmGeneratedFileStream(this_03,(string *)&f,false,None);
      __range3 = (mapped_type *)this_03;
      cmGeneratedFileStream::SetCopyIfDifferent(this_03,true);
      std::vector<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_>::push_back
                ((vector<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_> *)
                 &__range1_4,(value_type *)&__range3);
      poStack_320 = (ostream *)__range3;
      this_04 = GetGlobalGenerator(this);
      cmGlobalGhsMultiGenerator::WriteFileHeader(this_04,(ostream *)__range3);
      GhsMultiGpj::WriteGpjTag(SUBPROJECT,(ostream *)__range3);
      poVar15 = std::operator<<((ostream *)
                                sources.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                                (string *)(fpath.field_2._M_local_buf + 8));
      std::operator<<(poVar15," ");
      GhsMultiGpj::WriteGpjTag
                (SUBPROJECT,
                 (ostream *)
                 sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)&f);
      std::__cxx11::string::~string((string *)(fpath.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(lpath.field_2._M_local_buf + 8));
    }
    else {
      poStack_320 = (ostream *)
                    sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    if ((local_321 & 1) == 0) {
      uVar13 = std::__cxx11::string::empty();
      if ((uVar13 & 1) != 0) {
        poVar15 = std::operator<<(poStack_320,"{comment} Others");
        std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
      }
    }
    else {
      uVar13 = std::__cxx11::string::empty();
      if ((uVar13 & 1) == 0) {
        poVar15 = std::operator<<(poStack_320,"{comment} ");
        poVar15 = std::operator<<(poVar15,(string *)fout);
        std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar15 = std::operator<<(poStack_320,"{comment} Others");
        std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
      }
    }
    bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            fout,"CMake Rules");
    if (bVar4) {
      pmVar16 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                              *)&groupNames._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             (key_type *)fout);
      __end3 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin(pmVar16);
      si = (cmSourceFile *)
           std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end(pmVar16);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                                         *)&si), bVar4) {
        ppcVar17 = __gnu_cxx::
                   __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                   ::operator*(&__end3);
        this_02 = *ppcVar17;
        psVar14 = cmSourceFile::GetFullPath_abi_cxx11_(this_02);
        std::__cxx11::string::string((string *)(comment.field_2._M_local_buf + 8),(string *)psVar14)
        ;
        cmSystemTools::ConvertToOutputSlashes((string *)((long)&comment.field_2 + 8));
        std::__cxx11::string::string(local_448);
        local_469 = 0;
        if (this->TagType == CUSTOM_TARGET) {
          cmSourceFile::GetLanguage_abi_cxx11_(&local_468,this_02);
          local_469 = 1;
          bVar5 = std::__cxx11::string::empty();
          bVar4 = true;
          if ((bVar5 & 1) != 0) goto LAB_003007ac;
        }
        else {
LAB_003007ac:
          pcVar19 = cmSourceFile::GetCustomCommand(this_02);
          bVar4 = pcVar19 != (cmCustomCommand *)0x0;
        }
        if ((local_469 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_468);
        }
        if (bVar4) {
          std::__cxx11::string::operator=(local_448,"{comment} ");
        }
        fname.field_2._M_local_buf[0xf] = !bVar4;
        poVar15 = std::operator<<(poStack_320,local_448);
        poVar15 = std::operator<<(poVar15,(string *)(comment.field_2._M_local_buf + 8));
        std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
        if ((bool)fname.field_2._M_local_buf[0xf]) {
          psVar14 = cmSourceFile::GetExtension_abi_cxx11_(this_02);
          bVar4 = std::operator!=("ld",psVar14);
          if (bVar4) {
            psVar14 = cmSourceFile::GetExtension_abi_cxx11_(this_02);
            bVar4 = std::operator!=("int",psVar14);
            if (bVar4) {
              psVar14 = cmSourceFile::GetExtension_abi_cxx11_(this_02);
              bVar4 = std::operator!=("bsp",psVar14);
              if (bVar4) {
                WriteObjectLangOverride(poStack_320,this_02);
              }
            }
          }
          poVar15 = poStack_320;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_490,"INCLUDE_DIRECTORIES",&local_491);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b8,"-I",&local_4b9);
          WriteSourceProperty(this,poVar15,this_02,&local_490,&local_4b8);
          std::__cxx11::string::~string((string *)&local_4b8);
          std::allocator<char>::~allocator(&local_4b9);
          std::__cxx11::string::~string((string *)&local_490);
          std::allocator<char>::~allocator(&local_491);
          poVar15 = poStack_320;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4e0,"COMPILE_DEFINITIONS",&local_4e1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_508,"-D",&local_509);
          WriteSourceProperty(this,poVar15,this_02,&local_4e0,&local_508);
          std::__cxx11::string::~string((string *)&local_508);
          std::allocator<char>::~allocator(&local_509);
          std::__cxx11::string::~string((string *)&local_4e0);
          std::allocator<char>::~allocator(&local_4e1);
          poVar15 = poStack_320;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_530,"COMPILE_OPTIONS",&local_531);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_558,"",
                     (allocator<char> *)(objectName.field_2._M_local_buf + 0xf));
          WriteSourceProperty(this,poVar15,this_02,&local_530,&local_558);
          std::__cxx11::string::~string((string *)&local_558);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(objectName.field_2._M_local_buf + 0xf));
          std::__cxx11::string::~string((string *)&local_530);
          std::allocator<char>::~allocator(&local_531);
          psVar14 = cmGeneratorTarget::GetObjectName_abi_cxx11_(this->GeneratorTarget,this_02);
          std::__cxx11::string::string
                    ((string *)
                     &customCommands.
                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)psVar14);
          uVar13 = std::__cxx11::string::empty();
          if (((uVar13 & 1) == 0) &&
             (bVar4 = cmGeneratorTarget::HasExplicitObjectName(this->GeneratorTarget,this_02), bVar4
             )) {
            poVar15 = std::operator<<(poStack_320,"    -o ");
            poVar15 = std::operator<<(poVar15,(string *)
                                              &customCommands.
                                               super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
          }
          std::__cxx11::string::~string
                    ((string *)
                     &customCommands.
                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        std::__cxx11::string::~string(local_448);
        std::__cxx11::string::~string((string *)(comment.field_2._M_local_buf + 8));
        __gnu_cxx::
        __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
        ::operator++(&__end3);
      }
    }
    else {
      pvVar1 = (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
               ((long)&message.field_2 + 8);
      std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector(pvVar1);
      bVar4 = ComputeCustomCommandOrder(this,pvVar1);
      if (bVar4) {
        psVar14 = cmGeneratorTarget::GetName_abi_cxx11_(this->GeneratorTarget);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sf_1,
                       "The custom commands for target [",psVar14);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_5b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sf_1,
                       "] had a cycle.\n");
        std::__cxx11::string::~string((string *)&sf_1);
        cmSystemTools::Error((string *)local_5b8);
        std::__cxx11::string::~string((string *)local_5b8);
      }
      else {
        local_5e0._M_current =
             (cmSourceFile **)
             std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                       ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                        ((long)&message.field_2 + 8));
        while( true ) {
          local_5e8._M_current =
               (cmSourceFile **)
               std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                         ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                          ((long)&message.field_2 + 8));
          bVar4 = __gnu_cxx::operator!=(&local_5e0,&local_5e8);
          if (!bVar4) break;
          ppcVar18 = __gnu_cxx::
                     __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                     ::operator*(&local_5e0);
          pcVar20 = cmSourceFile::GetLocation(*ppcVar18);
          psVar14 = cmSourceFileLocation::GetName_abi_cxx11_(pcVar20);
          std::operator+(&local_608,&this->Name,".rule");
          _Var6 = std::operator==(psVar14,&local_608);
          std::__cxx11::string::~string((string *)&local_608);
          __first._M_current = local_5e0._M_current;
          if (_Var6) {
            __middle = __gnu_cxx::
                       __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                       ::operator+(&local_5e0,1);
            __last = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                               ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                 *)((long)&message.field_2 + 8));
            std::_V2::
            rotate<__gnu_cxx::__normal_iterator<cmSourceFile_const**,std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>>
                      (__first,__middle,
                       (__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                        )__last._M_current);
            break;
          }
          __gnu_cxx::
          __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
          ::operator++(&local_5e0);
        }
        __range4._4_4_ = 0;
        pvVar1 = (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                 ((long)&message.field_2 + 8);
        __end4 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                           (pvVar1);
        sf_2 = (cmSourceFile **)
               std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end(pvVar1)
        ;
        while (bVar4 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                                           *)&sf_2), bVar4) {
          ppcVar18 = __gnu_cxx::
                     __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                     ::operator*(&__end4);
          pcVar19 = cmSourceFile::GetCustomCommand(*ppcVar18);
          ccg.WorkingDirectory.field_2._8_8_ = pcVar19;
          std::__cxx11::string::string
                    ((string *)(fname_1.field_2._M_local_buf + 8),(string *)&this->ConfigName);
          cmCustomCommandGenerator::cmCustomCommandGenerator
                    ((cmCustomCommandGenerator *)local_700,pcVar19,
                     (string *)((long)&fname_1.field_2 + 8),
                     &this->LocalGenerator->super_cmLocalGenerator);
          std::__cxx11::string::~string((string *)(fname_1.field_2._M_local_buf + 8));
          psVar14 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                              (&this->LocalGenerator->super_cmLocalGenerator);
          std::__cxx11::string::string((string *)local_740,(string *)psVar14);
          (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xc])
                    (&local_780,this->LocalGenerator,this->GeneratorTarget);
          std::operator+(&local_760,"/",&local_780);
          std::__cxx11::string::operator+=((string *)local_740,(string *)&local_760);
          std::__cxx11::string::~string((string *)&local_760);
          std::__cxx11::string::~string((string *)&local_780);
          std::operator+(&local_7c0,"/",&this->Name);
          std::operator+(&local_7a0,&local_7c0,"_cc");
          std::__cxx11::string::operator+=((string *)local_740,(string *)&local_7a0);
          std::__cxx11::string::~string((string *)&local_7a0);
          std::__cxx11::string::~string((string *)&local_7c0);
          std::__cxx11::to_string((string *)&f_1.field_0x240,__range4._4_4_);
          std::operator+(&local_7e0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &f_1.field_0x240,"_");
          std::__cxx11::string::operator+=((string *)local_740,(string *)&local_7e0);
          std::__cxx11::string::~string((string *)&local_7e0);
          std::__cxx11::string::~string((string *)&f_1.field_0x240);
          pcVar20 = cmSourceFile::GetLocation(*ppcVar18);
          psVar14 = cmSourceFileLocation::GetName_abi_cxx11_(pcVar20);
          std::__cxx11::string::operator+=((string *)local_740,(string *)psVar14);
          pcVar12 = ".sh";
          if ((this->CmdWindowsShell & 1U) != 0) {
            pcVar12 = ".bat";
          }
          std::__cxx11::string::operator+=((string *)local_740,pcVar12);
          cmGeneratedFileStream::cmGeneratedFileStream
                    ((cmGeneratedFileStream *)&__range1_5,(string *)local_740,false,None);
          cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)&__range1_5,true);
          WriteCustomCommandsHelper
                    (this,(ostream *)&__range1_5,(cmCustomCommandGenerator *)local_700);
          cmGeneratedFileStream::Close((cmGeneratedFileStream *)&__range1_5);
          WriteCustomCommandLine
                    (this,poStack_320,(string *)local_740,(cmCustomCommandGenerator *)local_700);
          cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&__range1_5);
          std::__cxx11::string::~string((string *)local_740);
          cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)local_700)
          ;
          __gnu_cxx::
          __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
          ::operator++(&__end4);
          __range4._4_4_ = __range4._4_4_ + 1;
        }
      }
      if (this->TagType == CUSTOM_TARGET) {
        WriteBuildEvents(this,poStack_320);
      }
      std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
                ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                 ((long)&message.field_2 + 8));
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_4);
  } while( true );
}

Assistant:

void cmGhsMultiTargetGenerator::WriteSources(std::ostream& fout_proj)
{
  /* vector of all sources for this target */
  std::vector<cmSourceFile*> sources;
  this->GeneratorTarget->GetSourceFiles(sources, this->ConfigName);

  /* vector of all groups defined for this target
   * -- but the vector is not expanded with sub groups or in any useful order
   */
  std::vector<cmSourceGroup> sourceGroups = this->Makefile->GetSourceGroups();

  /* for each source file assign it to its group */
  std::map<std::string, std::vector<cmSourceFile*>> groupFiles;
  std::set<std::string> groupNames;
  for (auto& sf : sources) {
    cmSourceGroup* sourceGroup =
      this->Makefile->FindSourceGroup(sf->GetFullPath(), sourceGroups);
    std::string gn = sourceGroup->GetFullName();
    groupFiles[gn].push_back(sf);
    groupNames.insert(std::move(gn));
  }

  /* list of known groups and the order they are displayed in a project file */
  const std::vector<std::string> standardGroups = {
    "CMake Rules",  "Header Files",     "Source Files",
    "Object Files", "Object Libraries", "Resources"
  };

  /* list of groups in the order they are displayed in a project file*/
  std::vector<std::string> groupFilesList(groupFiles.size());

  /* put the groups in the order they should be listed
   * - standard groups first, and then everything else
   *   in the order used by std::map.
   */
  int i = 0;
  for (const std::string& gn : standardGroups) {
    auto n = groupNames.find(gn);
    if (n != groupNames.end()) {
      groupFilesList[i] = *n;
      i += 1;
      groupNames.erase(gn);
    } else if (this->TagType == GhsMultiGpj::CUSTOM_TARGET &&
               gn == "CMake Rules") {
      /* make sure that rules folder always exists in case of custom targets
       * that have no custom commands except for pre or post build events.
       */
      groupFilesList.resize(groupFilesList.size() + 1);
      groupFilesList[i] = gn;
      i += 1;
    }
  }

  { /* catch-all group - is last item */
    std::string gn;
    auto n = groupNames.find(gn);
    if (n != groupNames.end()) {
      groupFilesList.back() = *n;
      groupNames.erase(gn);
    }
  }

  for (auto& n : groupNames) {
    groupFilesList[i] = n;
    i += 1;
  }

  /* sort the files within each group */
  for (auto& n : groupFilesList) {
    std::sort(groupFiles[n].begin(), groupFiles[n].end(),
              [](cmSourceFile* l, cmSourceFile* r) {
                return l->GetFullPath() < r->GetFullPath();
              });
  }

  /* list of open project files */
  std::vector<cmGeneratedFileStream*> gfiles;

  /* write files into the proper project file
   * -- groups go into main project file
   *    unless NO_SOURCE_GROUP_FILE property or variable is set.
   */
  for (auto& sg : groupFilesList) {
    std::ostream* fout;
    bool useProjectFile =
      cmSystemTools::IsOn(
        this->GeneratorTarget->GetProperty("GHS_NO_SOURCE_GROUP_FILE")) ||
      cmSystemTools::IsOn(
        this->Makefile->GetDefinition("CMAKE_GHS_NO_SOURCE_GROUP_FILE"));
    if (useProjectFile || sg.empty()) {
      fout = &fout_proj;
    } else {
      // Open the filestream in copy-if-different mode.
      std::string gname = sg;
      cmsys::SystemTools::ReplaceString(gname, "\\", "_");
      std::string lpath =
        this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget);
      lpath += "/";
      lpath += gname;
      lpath += cmGlobalGhsMultiGenerator::FILE_EXTENSION;
      std::string fpath = this->LocalGenerator->GetCurrentBinaryDirectory();
      fpath += "/";
      fpath += lpath;
      cmGeneratedFileStream* f = new cmGeneratedFileStream(fpath);
      f->SetCopyIfDifferent(true);
      gfiles.push_back(f);
      fout = f;
      this->GetGlobalGenerator()->WriteFileHeader(*f);
      GhsMultiGpj::WriteGpjTag(GhsMultiGpj::SUBPROJECT, *f);
      fout_proj << lpath << " ";
      GhsMultiGpj::WriteGpjTag(GhsMultiGpj::SUBPROJECT, fout_proj);
    }

    if (useProjectFile) {
      if (sg.empty()) {
        *fout << "{comment} Others" << std::endl;
      } else {
        *fout << "{comment} " << sg << std::endl;
      }
    } else if (sg.empty()) {
      *fout << "{comment} Others" << std::endl;
    }

    if (sg != "CMake Rules") {
      /* output rule for each source file */
      for (const cmSourceFile* si : groupFiles[sg]) {
        bool compile = true;
        // Convert filename to native system
        // WORKAROUND: GHS MULTI 6.1.4 and 6.1.6 are known to need backslash on
        // windows when opening some files from the search window.
        std::string fname(si->GetFullPath());
        cmSystemTools::ConvertToOutputSlashes(fname);

        /* For custom targets list any associated sources,
         * comment out source code to prevent it from being
         * compiled when processing this target.
         * Otherwise, comment out any custom command (main) dependencies that
         * are listed as source files to prevent them from being considered
         * part of the build.
         */
        std::string comment;
        if ((this->TagType == GhsMultiGpj::CUSTOM_TARGET &&
             !si->GetLanguage().empty()) ||
            si->GetCustomCommand()) {
          comment = "{comment} ";
          compile = false;
        }

        *fout << comment << fname << std::endl;
        if (compile) {
          if ("ld" != si->GetExtension() && "int" != si->GetExtension() &&
              "bsp" != si->GetExtension()) {
            WriteObjectLangOverride(*fout, si);
          }

          this->WriteSourceProperty(*fout, si, "INCLUDE_DIRECTORIES", "-I");
          this->WriteSourceProperty(*fout, si, "COMPILE_DEFINITIONS", "-D");
          this->WriteSourceProperty(*fout, si, "COMPILE_OPTIONS", "");

          /* to avoid clutter in the GUI only print out the objectName if it
           * has been renamed */
          std::string objectName = this->GeneratorTarget->GetObjectName(si);
          if (!objectName.empty() &&
              this->GeneratorTarget->HasExplicitObjectName(si)) {
            *fout << "    -o " << objectName << std::endl;
          }
        }
      }
    } else {
      std::vector<cmSourceFile const*> customCommands;
      if (ComputeCustomCommandOrder(customCommands)) {
        std::string message = "The custom commands for target [" +
          this->GeneratorTarget->GetName() + "] had a cycle.\n";
        cmSystemTools::Error(message);
      } else {
        /* Custom targets do not have a dependency on SOURCES files.
         * Therefore the dependency list may include SOURCES files after the
         * custom target. Because nothing can depend on the custom target just
         * move it to the last item.
         */
        for (auto sf = customCommands.begin(); sf != customCommands.end();
             ++sf) {
          if (((*sf)->GetLocation()).GetName() == this->Name + ".rule") {
            std::rotate(sf, sf + 1, customCommands.end());
            break;
          }
        }
        int cmdcount = 0;
        for (auto& sf : customCommands) {
          const cmCustomCommand* cc = sf->GetCustomCommand();
          cmCustomCommandGenerator ccg(*cc, this->ConfigName,
                                       this->LocalGenerator);

          // Open the filestream for this custom command
          std::string fname =
            this->LocalGenerator->GetCurrentBinaryDirectory();
          fname += "/" +
            this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget);
          fname += "/" + this->Name + "_cc";
          fname += std::to_string(cmdcount++) + "_";
          fname += (sf->GetLocation()).GetName();
          fname += this->CmdWindowsShell ? ".bat" : ".sh";
          cmGeneratedFileStream f(fname);
          f.SetCopyIfDifferent(true);
          this->WriteCustomCommandsHelper(f, ccg);
          f.Close();
          this->WriteCustomCommandLine(*fout, fname, ccg);
        }
      }
      if (this->TagType == GhsMultiGpj::CUSTOM_TARGET) {
        this->WriteBuildEvents(*fout);
      }
    }
  }

  for (cmGeneratedFileStream* f : gfiles) {
    f->Close();
  }
}